

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O1

Texture * __thiscall
rengine::OpenGLRenderer::createTextureFromImageData
          (OpenGLRenderer *this,vec2 size,Format format,void *data)

{
  OpenGLTexture *this_00;
  float local_38;
  float fStack_34;
  
  this_00 = (OpenGLTexture *)operator_new(0x18);
  (this_00->super_Texture)._vptr_Texture = (_func_int **)&PTR__OpenGLTexture_00138cd8;
  this_00->m_id = 0;
  (this_00->m_size).x = 0.0;
  (this_00->m_size).y = 0.0;
  local_38 = size.x;
  fStack_34 = size.y;
  this_00->m_format = format;
  OpenGLTexture::upload(this_00,(int)local_38,(int)fStack_34,data);
  return &this_00->super_Texture;
}

Assistant:

inline Texture *OpenGLRenderer::createTextureFromImageData(vec2 size, Texture::Format format, void *data)
{
    OpenGLTexture *texture = new OpenGLTexture();
    texture->setFormat(format);
    texture->upload(size.x, size.y, data);
    return texture;
}